

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::compoundStmt(Parser *this)

{
  Lexer *pLVar1;
  uint uVar2;
  _Head_base<0UL,_flow::lang::Symbol_*,_false> _Var3;
  bool bVar4;
  pointer __p;
  pointer *__ptr;
  Parser *in_RSI;
  _Head_base<0UL,_flow::lang::Symbol_*,_false> local_78;
  _Head_base<0UL,_flow::lang::Symbol_*,_false> local_70;
  undefined1 local_68 [8];
  SourceLocation sloc;
  
  SourceLocation::SourceLocation
            (&sloc,&((in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_);
  nextToken(in_RSI);
  std::make_unique<flow::lang::CompoundStmt,flow::SourceLocation&>((SourceLocation *)local_68);
  while (((in_RSI->lexer_)._M_t.
          super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
          super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
          super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_ == Var) {
    varDecl((Parser *)&local_78);
    _Var3._M_head_impl = local_78._M_head_impl;
    if (local_78._M_head_impl == (Symbol *)0x0) goto LAB_00127e59;
    local_78._M_head_impl = (Symbol *)0x0;
    local_70._M_head_impl = _Var3._M_head_impl;
    SymbolTable::appendSymbol
              (in_RSI->scopeStack_,
               (unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *)&local_70
              );
    if (local_70._M_head_impl != (Symbol *)0x0) {
      (*((local_70._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
    }
    local_70._M_head_impl = (Symbol *)0x0;
    if (local_78._M_head_impl != (Symbol *)0x0) {
      (*((local_78._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
    }
  }
  while (bVar4 = consumeIf(in_RSI,End), !bVar4) {
    stmt((Parser *)&local_78);
    if (local_78._M_head_impl == (Symbol *)0x0) goto LAB_00127e59;
    CompoundStmt::push_back
              ((CompoundStmt *)local_68,
               (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)&local_78);
    if (local_78._M_head_impl != (Symbol *)0x0) {
      (*((local_78._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
    }
  }
  pLVar1 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  *(uint *)((long)local_68 + 0x3c) = (pLVar1->lastLocation_).end.offset;
  uVar2 = (pLVar1->lastLocation_).end.column;
  ((FilePos *)((long)local_68 + 0x34))->line = (pLVar1->lastLocation_).end.line;
  ((FilePos *)((long)local_68 + 0x34))->column = uVar2;
  *(undefined1 (*) [8])&(this->features_)._M_t._M_impl = local_68;
LAB_00127e89:
  std::__cxx11::string::~string((string *)&sloc);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
LAB_00127e59:
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  if (local_68 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_68 + 8))();
  }
  goto LAB_00127e89;
}

Assistant:

std::unique_ptr<Stmt> Parser::compoundStmt() {
  SourceLocation sloc(location());
  nextToken();  // '{'

  std::unique_ptr<CompoundStmt> cs = std::make_unique<CompoundStmt>(sloc);

  while (token() == Token::Var) {
    if (std::unique_ptr<VariableSym> var = varDecl())
      currentScope()->appendSymbol(std::move(var));
    else
      return nullptr;
  }

  for (;;) {
    if (consumeIf(Token::End)) {
      cs->location().update(end());
      return std::unique_ptr<Stmt>(cs.release());
    }

    if (std::unique_ptr<Stmt> s = stmt())
      cs->push_back(std::move(s));
    else
      return nullptr;
  }
}